

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

bool __thiscall IR::Instr::AreAllOpndInt64(Instr *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = true;
  bVar1 = true;
  if (this->m_dst != (Opnd *)0x0) {
    bVar1 = IRType_IsInt64(this->m_dst->m_type);
  }
  if (this->m_src1 != (Opnd *)0x0) {
    bVar2 = IRType_IsInt64(this->m_src1->m_type);
  }
  if (this->m_src2 == (Opnd *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = IRType_IsInt64(this->m_src2->m_type);
  }
  if (bVar1 == false) {
    bVar2 = false;
  }
  else {
    bVar2 = (bool)(bVar2 & bVar3);
  }
  return bVar2;
}

Assistant:

bool Instr::AreAllOpndInt64() const
{
    bool isDstInt64 = !m_dst || IRType_IsInt64(m_dst->GetType());
    bool isSrc1Int64 = !m_src1 || IRType_IsInt64(m_src1->GetType());
    bool isSrc2Int64 = !m_src2 || IRType_IsInt64(m_src2->GetType());
    return isDstInt64 && isSrc1Int64 && isSrc2Int64;
}